

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

nh_bool find_role(nh_roles_info *ri,char *role_str,int *out_role)

{
  int iVar1;
  int local_2c;
  int i;
  int *out_role_local;
  char *role_str_local;
  nh_roles_info *ri_local;
  
  local_2c = 0;
  while( true ) {
    if (ri->num_roles <= local_2c) {
      return '\0';
    }
    iVar1 = strcmp(role_str,ri->rolenames_m[local_2c]);
    if ((iVar1 == 0) ||
       ((ri->rolenames_f[local_2c] != (char *)0x0 &&
        (iVar1 = strcmp(role_str,ri->rolenames_f[local_2c]), iVar1 == 0)))) break;
    local_2c = local_2c + 1;
  }
  *out_role = local_2c;
  return '\x01';
}

Assistant:

static nh_bool find_role(const struct nh_roles_info *ri,
			 const char *role_str, int *out_role)
{
    int i;

    for (i = 0; i < ri->num_roles; i++) {
	if (!strcmp(role_str, ri->rolenames_m[i]) ||
	    (ri->rolenames_f[i] && !strcmp(role_str, ri->rolenames_f[i]))) {
	    *out_role = i;
	    return TRUE;
	}
    }
    return FALSE;
}